

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_huff.c
# Opt level: O0

block_state deflate_huff(deflate_state *s,int flush)

{
  int iVar1;
  int in_ESI;
  deflate_state *in_RDI;
  int bflush;
  deflate_state *in_stack_ffffffffffffffd0;
  deflate_state *strm;
  uchar *in_stack_ffffffffffffffd8;
  deflate_state *in_stack_ffffffffffffffe0;
  
  while ((in_RDI->lookahead != 0 ||
         (zng_fill_window(in_stack_ffffffffffffffd0), in_RDI->lookahead != 0))) {
    iVar1 = zng_tr_tally_lit(in_RDI,in_RDI->window[in_RDI->strstart]);
    in_RDI->lookahead = in_RDI->lookahead - 1;
    in_RDI->strstart = in_RDI->strstart + 1;
    if (iVar1 != 0) {
      if (in_RDI->block_start < 0) {
        in_stack_ffffffffffffffd8 = (uchar *)0x0;
      }
      else {
        in_stack_ffffffffffffffd8 = in_RDI->window + (uint)in_RDI->block_start;
      }
      in_stack_ffffffffffffffe0 = in_RDI;
      zng_tr_flush_block(in_RDI,(char *)in_stack_ffffffffffffffd8,
                         (uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                         (int)in_stack_ffffffffffffffd0);
      in_RDI->block_start = in_RDI->strstart;
      zng_flush_pending((zng_stream *)in_stack_ffffffffffffffd0);
      if (in_RDI->strm->avail_out == 0) {
        return need_more;
      }
    }
  }
  if (in_ESI == 0) {
    return need_more;
  }
  in_RDI->insert = 0;
  if (in_ESI != 4) {
    if (in_RDI->sym_next != 0) {
      zng_tr_flush_block(in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                         (uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                         (int)in_stack_ffffffffffffffd0);
      in_RDI->block_start = in_RDI->strstart;
      zng_flush_pending((zng_stream *)in_stack_ffffffffffffffd0);
      if (in_RDI->strm->avail_out == 0) {
        return need_more;
      }
    }
    return block_done;
  }
  strm = in_RDI;
  zng_tr_flush_block(in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                     (uint32_t)((ulong)in_RDI >> 0x20),(int)in_RDI);
  in_RDI->block_start = in_RDI->strstart;
  zng_flush_pending((zng_stream *)strm);
  if (in_RDI->strm->avail_out == 0) {
    return finish_started;
  }
  return finish_done;
}

Assistant:

Z_INTERNAL block_state deflate_huff(deflate_state *s, int flush) {
    int bflush = 0;         /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we have a literal to write. */
        if (s->lookahead == 0) {
            PREFIX(fill_window)(s);
            if (s->lookahead == 0) {
                if (flush == Z_NO_FLUSH)
                    return need_more;
                break;      /* flush the current block */
            }
        }

        /* Output a literal byte */
        bflush = zng_tr_tally_lit(s, s->window[s->strstart]);
        s->lookahead--;
        s->strstart++;
        if (bflush)
            FLUSH_BLOCK(s, 0);
    }
    s->insert = 0;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->sym_next)
        FLUSH_BLOCK(s, 0);
    return block_done;
}